

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

void Abc_SclTimeCone(SC_Man *p,Vec_Int_t *vCone)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  SC_Pair *pSVar5;
  Abc_Obj_t *pObj;
  int iVar6;
  long lVar7;
  
  iVar6 = vCone->nSize;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      iVar1 = vCone->pArray[lVar7];
      if (((long)iVar1 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar1)) goto LAB_003f66b0;
      pvVar4 = pVVar3->pArray[iVar1];
      if (pvVar4 != (void *)0x0) {
        pSVar5 = p->pTimes;
        uVar2 = *(uint *)((long)pvVar4 + 0x10);
        pSVar5[uVar2].rise = 0.0;
        pSVar5[uVar2].fall = 0.0;
        pSVar5 = p->pSlews;
        uVar2 = *(uint *)((long)pvVar4 + 0x10);
        pSVar5[uVar2].rise = 0.0;
        pSVar5[uVar2].fall = 0.0;
        iVar6 = vCone->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
    if (0 < iVar6) {
      lVar7 = 0;
      do {
        iVar1 = vCone->pArray[lVar7];
        if (((long)iVar1 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar1)) {
LAB_003f66b0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj = (Abc_Obj_t *)pVVar3->pArray[iVar1];
        if (pObj != (Abc_Obj_t *)0x0) {
          Abc_SclTimeNode(p,pObj,0);
          iVar6 = vCone->nSize;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar6);
    }
  }
  return;
}

Assistant:

void Abc_SclTimeCone( SC_Man * p, Vec_Int_t * vCone )
{
    int fVerbose = 0;
    Abc_Obj_t * pObj;
    int i;
    Abc_SclConeClean( p, vCone );
    Abc_NtkForEachObjVec( vCone, p->pNtk, pObj, i )
    {
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "  Updating node %d with gate %s\n", Abc_ObjId(pObj), Abc_SclObjCell(pObj)->pName );
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "    before (%6.1f ps  %6.1f ps)   ", Abc_SclObjTimeOne(p, pObj, 1), Abc_SclObjTimeOne(p, pObj, 0) );
        Abc_SclTimeNode( p, pObj, 0 );
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "after (%6.1f ps  %6.1f ps)\n", Abc_SclObjTimeOne(p, pObj, 1), Abc_SclObjTimeOne(p, pObj, 0) );
    }
}